

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O3

int main(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Process with time limit...",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  ProcessByTime();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Process with count limit...",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  ProcessByCount();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Process without limit...",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  ResourceConsumingWorker();
  return 0;
}

Assistant:

int main() {
  std::cerr << "Process with time limit..." << std::endl;
  ProcessByTime();
  std::cerr << "Process with count limit..." << std::endl;
  ProcessByCount();
  std::cerr << "Process without limit..." << std::endl;
  ResourceConsumingWorker();
}